

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O0

void __thiscall SGParser::Generator::Production::~Production(Production *this)

{
  uint uVar1;
  Production *this_local;
  
  if (((this->pRight != (uint *)0x0) &&
      (uVar1 = *this->pRight - 1, *this->pRight = uVar1, uVar1 == 0)) &&
     (this->pRight != (uint *)0x0)) {
    operator_delete__(this->pRight);
  }
  std::
  map<unsigned_int,_SGParser::Generator::Production::ConflictAction,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
  ::~map(&this->ConflictActions);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->LeftChain);
  std::
  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::~map(&this->ReduceOverrides);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Production::~Production() {
    // Delete RHS
    if (pRight)
        if (!(--pRight[0u]))
            delete[] pRight;
}